

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector_manyvector.c
# Opt level: O0

void set_element(N_Vector X,sunindextype i,sunrealtype val)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunindextype x0len;
  N_Vector Xsub [2];
  
  plVar1 = (long *)N_VGetSubvector_ManyVector(in_RDI,0);
  plVar2 = (long *)N_VGetSubvector_ManyVector(in_RDI,1);
  lVar3 = N_VGetLength(plVar1);
  if (in_RSI < lVar3) {
    *(undefined8 *)(*(long *)(*plVar1 + 0x10) + in_RSI * 8) = in_XMM0_Qa;
  }
  else {
    *(undefined8 *)(*(long *)(*plVar2 + 0x10) + (in_RSI - lVar3) * 8) = in_XMM0_Qa;
  }
  return;
}

Assistant:

void set_element(N_Vector X, sunindextype i, sunrealtype val)
{
  N_Vector Xsub[2];
  sunindextype x0len;

  Xsub[0] = N_VGetSubvector_ManyVector(X, 0);
  Xsub[1] = N_VGetSubvector_ManyVector(X, 1);
  x0len   = N_VGetLength(Xsub[0]);

  /* set i-th element of data array (in appropriate subvector) */
  if (i < x0len) { NV_Ith_S(Xsub[0], i) = val; }
  else { NV_Ith_S(Xsub[1], i - x0len) = val; }
}